

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SGDOptimizer::clear_learningrate(SGDOptimizer *this)

{
  DoubleParameter *this_00;
  Arena *pAVar1;
  SGDOptimizer *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->learningrate_ != (DoubleParameter *)0x0)) &&
     (this_00 = this->learningrate_, this_00 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(this_00);
    operator_delete(this_00,0x28);
  }
  this->learningrate_ = (DoubleParameter *)0x0;
  return;
}

Assistant:

void SGDOptimizer::clear_learningrate() {
  if (GetArenaForAllocation() == nullptr && learningrate_ != nullptr) {
    delete learningrate_;
  }
  learningrate_ = nullptr;
}